

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.hpp
# Opt level: O1

void __thiscall duckdb::StrTimeFormat::~StrTimeFormat(StrTimeFormat *this)

{
  ~StrTimeFormat(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~StrTimeFormat() {
	}